

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
          (PersistentStorageJson *this)

{
  PersistentStorageJson *this_local;
  
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_0046a230;
  (*(this->super_PersistentStorage)._vptr_PersistentStorage[3])();
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::clear(&this->mCache);
  os::semaphore::SemaphoreClose(&this->mStorageLock);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&this->mCache);
  std::__cxx11::string::~string((string *)&this->mFileName);
  PersistentStorage::~PersistentStorage(&this->super_PersistentStorage);
  return;
}

Assistant:

PersistentStorageJson::~PersistentStorageJson()
{
    Close();
    mCache.clear();
    SemaphoreClose(mStorageLock);
}